

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void child_setup(double *child_cub,double x,double y,double z,double dist)

{
  int i;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  *child_cub = x;
  child_cub[1] = y;
  child_cub[2] = z;
  dVar3 = x + dist;
  child_cub[3] = dVar3;
  child_cub[4] = y;
  child_cub[5] = z;
  child_cub[6] = dVar3;
  dVar4 = y + dist;
  child_cub[7] = dVar4;
  child_cub[8] = z;
  child_cub[9] = x;
  child_cub[10] = dVar4;
  child_cub[0xb] = z;
  child_cub[0xc] = x;
  child_cub[0xd] = y;
  dVar2 = z + dist;
  child_cub[0xe] = dVar2;
  child_cub[0xf] = dVar3;
  child_cub[0x10] = y;
  child_cub[0x11] = dVar2;
  child_cub[0x12] = dVar3;
  child_cub[0x13] = dVar4;
  child_cub[0x14] = dVar2;
  child_cub[0x15] = x;
  child_cub[0x16] = dVar4;
  child_cub[0x17] = dVar2;
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    if (1.0 < child_cub[lVar1]) {
      child_cub[lVar1] = 1.0;
    }
  }
  return;
}

Assistant:

void child_setup(double *child_cub,double x,double y,double z,double dist)
{
	child_cub[0]=x;				child_cub[1]=y;				child_cub[2]=z;

	child_cub[3]=x+dist;		child_cub[4]=y;				child_cub[5]=z;

	child_cub[6]=x+dist;		child_cub[7]=y+dist;		child_cub[8]=z;

	child_cub[9]=x;				child_cub[10]=y+dist;		child_cub[11]=z;


	child_cub[12]=x;			child_cub[13]=y;			child_cub[14]=z+dist;

	child_cub[15]=x+dist;		child_cub[16]=y;			child_cub[17]=z+dist;

	child_cub[18]=x+dist;		child_cub[19]=y+dist;		child_cub[20]=z+dist;

	child_cub[21]=x;			child_cub[22]=y+dist;		child_cub[23]=z+dist;

	for (int i = 0; i < 24; i++)
	{
		if (child_cub[i]>1.0)	child_cub[i]=1.0;
	}

}